

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall
NavierStokesBase::restart(NavierStokesBase *this,Amr *papa,istream *is,bool bReadSpecial)

{
  DistributionMapping *dm;
  pointer pSVar1;
  pointer pBVar2;
  pointer pBVar3;
  double time;
  double time_00;
  char cVar4;
  TimeCenter TVar5;
  int iVar6;
  int ngrow;
  StateDescriptor *d;
  Projection *this_00;
  MacProj *this_01;
  SyncRegister *this_02;
  FluxRegister *pFVar7;
  Diffusion *this_03;
  NavierStokesBase *pNVar8;
  MultiFab *pMVar9;
  Diffusion *Coarser;
  long lVar10;
  BoxArray *ba;
  BoxArray *pBVar11;
  Amr *pAVar12;
  byte bVar13;
  undefined1 local_1e8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_1d8 [15];
  vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> local_60;
  vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> local_48;
  
  bVar13 = 0;
  local_1e8._8_8_ = amrex::OutStream();
  local_1e8._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
  local_1e8._0_4_ = *(int *)(DAT_0071a620 + -0x30);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)avStack_1d8);
  *(undefined8 *)
   ((long)&avStack_1d8[0].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish +
   avStack_1d8[0].
   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
       *(undefined8 *)
        ((*(_func_int ***)local_1e8._8_8_)[-3] +
        (long)&((ArenaInfo *)(local_1e8._8_8_ + 8))->release_threshold);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)avStack_1d8,
             "\nWARNING! Note that you can\'t drop data from the checkpoint file.\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)avStack_1d8,
             " If your checkpoint file contains Average_Type, then your inputs\n",0x41);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)avStack_1d8," must also specify ns.avg_interval>0.\n",0x26);
  cVar4 = (char)(ostringstream *)avStack_1d8;
  std::ios::widen((char)avStack_1d8[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  amrex::Print::~Print((Print *)local_1e8);
  amrex::AmrLevel::restart(&this->super_AmrLevel,papa,is,bReadSpecial);
  if (gradp_in_checkpoint == 0) {
    local_1e8._8_8_ = amrex::OutStream();
    local_1e8._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    local_1e8._0_4_ = *(int *)(DAT_0071a620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)avStack_1d8);
    *(undefined8 *)
     ((long)&avStack_1d8[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     avStack_1d8[0].
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
         *(undefined8 *)
          ((*(_func_int ***)local_1e8._8_8_)[-3] +
          (long)&((ArenaInfo *)(local_1e8._8_8_ + 8))->release_threshold);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)avStack_1d8,
               "WARNING! GradP not found in checkpoint file. Recomputing from Pressure.",0x47);
    std::ios::widen((char)avStack_1d8[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    amrex::Print::~Print((Print *)local_1e8);
    pSVar1 = (this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar5 = amrex::StateDescriptor::timeType(pSVar1[1].desc);
    if (TVar5 == Point) {
      time = pSVar1[1].new_time.stop;
    }
    else {
      time = (pSVar1[1].new_time.start + pSVar1[1].new_time.stop) * 0.5;
    }
    pSVar1 = (this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar5 = amrex::StateDescriptor::timeType(pSVar1[1].desc);
    if (TVar5 == Point) {
      time_00 = pSVar1[1].old_time.stop;
    }
    else {
      time_00 = (pSVar1[1].old_time.start + pSVar1[1].old_time.stop) * 0.5;
    }
    pSVar1 = (this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    d = amrex::DescriptorList::operator[]((DescriptorList *)amrex::AmrLevel::desc_lst,2);
    amrex::StateData::define
              (pSVar1 + 2,&(this->super_AmrLevel).geom.domain,&(this->super_AmrLevel).grids,
               &(this->super_AmrLevel).dmap,d,(time + time_00) * 0.5,time - time_00,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    computeGradP(this,time);
    amrex::StateData::allocOldData
              ((this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start + 2);
    computeGradP(this,time_00);
  }
  buildMetrics(this);
  if (projector == (Projection *)0x0) {
    this_00 = (Projection *)operator_new(0x68);
    pAVar12 = (this->super_AmrLevel).parent;
    Projection::Projection
              (this_00,pAVar12,&phys_bc,do_sync_proj,
               *(int *)&(pAVar12->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,radius_grow)
    ;
    projector = this_00;
  }
  Projection::install_level
            (projector,(this->super_AmrLevel).level,&this->super_AmrLevel,&this->radius);
  if (mac_projector == (MacProj *)0x0) {
    this_01 = (MacProj *)operator_new(0x60);
    pAVar12 = (this->super_AmrLevel).parent;
    MacProj::MacProj(this_01,pAVar12,
                     *(int *)&(pAVar12->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
                     &phys_bc,radius_grow);
    mac_projector = this_01;
  }
  MacProj::install_level(mac_projector,(this->super_AmrLevel).level,&this->super_AmrLevel);
  pSVar1 = (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  ba = &(this->super_AmrLevel).grids;
  dm = &(this->super_AmrLevel).dmap;
  init_eb(this,(((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.geom.
               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start + (this->super_AmrLevel).level,ba,dm);
  if (0 < (this->super_AmrLevel).level) {
    local_1e8._0_8_ = (pointer)0x1;
    local_1e8._8_8_ = (Arena *)0x0;
    avStack_1d8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_1d8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_1d8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::define
              (&this->rho_avg,ba,dm,1,1,(MFInfo *)local_1e8,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(avStack_1d8);
    local_1e8._0_8_ = (pointer)0x1;
    local_1e8._8_8_ = (Arena *)0x0;
    avStack_1d8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_1d8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_1d8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::define
              (&this->p_avg,&pSVar1[1].grids,dm,1,0,(MFInfo *)local_1e8,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(avStack_1d8);
  }
  local_1e8._0_8_ = (pointer)0x1;
  local_1e8._8_8_ = (Arena *)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::define
            (&this->rho_half,ba,dm,1,1,(MFInfo *)local_1e8,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_1d8);
  local_1e8._0_8_ = (pointer)0x1;
  local_1e8._8_8_ = (Arena *)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::define
            (&this->rho_ptime,ba,dm,1,1,(MFInfo *)local_1e8,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_1d8);
  local_1e8._0_8_ = (pointer)0x1;
  local_1e8._8_8_ = (Arena *)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::define
            (&this->rho_ctime,ba,dm,1,1,(MFInfo *)local_1e8,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_1d8);
  this->rho_qtime = (MultiFab *)0x0;
  this->rho_tqtime = (MultiFab *)0x0;
  iVar6 = (this->super_AmrLevel).level;
  if ((0 < iVar6) && (do_sync_proj != 0)) {
    this_02 = (SyncRegister *)operator_new(0x1280);
    SyncRegister::SyncRegister(this_02,ba,dm,&(this->super_AmrLevel).crse_ratio);
    this->sync_reg = this_02;
    iVar6 = (this->super_AmrLevel).level;
  }
  if (do_reflux != 0 && 0 < iVar6) {
    pFVar7 = (FluxRegister *)operator_new(0x988);
    amrex::FluxRegister::FluxRegister
              (pFVar7,ba,dm,&(this->super_AmrLevel).crse_ratio,iVar6,NUM_STATE);
    this->advflux_reg = pFVar7;
    iVar6 = (this->super_AmrLevel).level;
  }
  if ((0 < iVar6) && (do_reflux != 0)) {
    pFVar7 = (FluxRegister *)operator_new(0x988);
    amrex::FluxRegister::FluxRegister
              (pFVar7,ba,dm,&(this->super_AmrLevel).crse_ratio,iVar6,NUM_STATE);
    this->viscflux_reg = pFVar7;
    iVar6 = (this->super_AmrLevel).level;
  }
  pAVar12 = (this->super_AmrLevel).parent;
  if (iVar6 < *(int *)&(pAVar12->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
    iVar6 = std::__cxx11::string::compare((char *)&redistribution_type_abi_cxx11_);
    ngrow = 1;
    if (iVar6 == 0) {
      ngrow = nghost_state(this);
    }
    local_1e8._0_8_ = (pointer)0x1;
    local_1e8._8_8_ = (Arena *)0x0;
    avStack_1d8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_1d8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_1d8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::define
              (&this->Vsync,ba,dm,3,ngrow,(MFInfo *)local_1e8,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(avStack_1d8);
    local_1e8._0_8_ = (pointer)0x1;
    local_1e8._8_8_ = (Arena *)0x0;
    avStack_1d8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_1d8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_1d8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MultiFab::define
              (&this->Ssync,ba,dm,NUM_STATE + -3,ngrow,(MFInfo *)local_1e8,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(avStack_1d8);
    iVar6 = (this->super_AmrLevel).level;
    pAVar12 = (this->super_AmrLevel).parent;
  }
  this_03 = (Diffusion *)operator_new(0x50);
  if (iVar6 < 1) {
    Coarser = (Diffusion *)0x0;
  }
  else {
    pNVar8 = getLevel(this,iVar6 + -1);
    Coarser = pNVar8->diffusion;
  }
  Diffusion::Diffusion(this_03,pAVar12,this,Coarser,NUM_STATE,this->viscflux_reg,&is_diffusive);
  this->diffusion = this_03;
  pMVar9 = (MultiFab *)operator_new(0x180);
  local_1e8._0_8_ = (pointer)0x1;
  local_1e8._8_8_ = (Arena *)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            (pMVar9,ba,dm,NUM_STATE + -4,1,(MFInfo *)local_1e8,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  this->diffn_cc = pMVar9;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_1d8);
  pMVar9 = (MultiFab *)operator_new(0x180);
  local_1e8._0_8_ = (pointer)0x1;
  local_1e8._8_8_ = (Arena *)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            (pMVar9,ba,dm,NUM_STATE + -4,1,(MFInfo *)local_1e8,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  this->diffnp1_cc = pMVar9;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_1d8);
  pMVar9 = (MultiFab *)operator_new(0x180);
  local_1e8._0_8_ = (pointer)0x1;
  local_1e8._8_8_ = (Arena *)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            (pMVar9,ba,dm,1,1,(MFInfo *)local_1e8,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  this->viscn_cc = pMVar9;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_1d8);
  pMVar9 = (MultiFab *)operator_new(0x180);
  local_1e8._0_8_ = (pointer)0x1;
  local_1e8._8_8_ = (Arena *)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            (pMVar9,ba,dm,1,1,(MFInfo *)local_1e8,
             (this->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  this->viscnp1_cc = pMVar9;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_1d8);
  pBVar11 = &this->old_intersect_new;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    *(undefined8 *)&pBVar11->m_bat = *(undefined8 *)&ba->m_bat;
    ba = (BoxArray *)((long)ba + (ulong)bVar13 * -0x10 + 8);
    pBVar11 = (BoxArray *)((long)pBVar11 + (ulong)bVar13 * -0x10 + 8);
  }
  (this->old_intersect_new).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->super_AmrLevel).grids.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->old_intersect_new).m_ref.
              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(this->super_AmrLevel).grids.m_ref.
              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->old_intersect_new).m_simplified_list.
  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_AmrLevel).grids.m_simplified_list.
       super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->old_intersect_new).m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(this->super_AmrLevel).grids.m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize
            (&(this->m_bcrec_velocity).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,3);
  fetchBCArray((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_1e8,this,0,0,3);
  pBVar2 = (this->m_bcrec_velocity).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar3 = (this->m_bcrec_velocity).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->m_bcrec_velocity).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1e8._0_8_;
  (this->m_bcrec_velocity).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_1e8._8_8_;
  (this->m_bcrec_velocity).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)avStack_1d8[0].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8._8_8_ = (Arena *)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (pBVar2 != (pointer)0x0) {
    operator_delete(pBVar2,(long)pBVar3 - (long)pBVar2);
    if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1e8._0_8_,
                      (long)avStack_1d8[0].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - local_1e8._0_8_);
    }
  }
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize(&this->m_bcrec_velocity_d,3)
  ;
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            (&local_48,
             &(this->m_bcrec_velocity).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
  amrex::convertToDeviceVector<amrex::BCRec>
            ((DeviceVector<amrex::BCRec> *)local_1e8,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&local_48);
  operator_delete((this->m_bcrec_velocity_d).m_data,(this->m_bcrec_velocity_d).m_capacity * 0x18);
  (this->m_bcrec_velocity_d).m_data = (pointer)local_1e8._0_8_;
  (this->m_bcrec_velocity_d).m_size = local_1e8._8_8_;
  (this->m_bcrec_velocity_d).m_capacity =
       (size_type)
       avStack_1d8[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8._8_8_ = (Arena *)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_48.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize
            (&(this->m_bcrec_scalars).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
             (long)NUM_SCALARS);
  fetchBCArray((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_1e8,this,0,3,NUM_SCALARS
              );
  pBVar2 = (this->m_bcrec_scalars).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar3 = (this->m_bcrec_scalars).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->m_bcrec_scalars).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1e8._0_8_;
  (this->m_bcrec_scalars).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_1e8._8_8_;
  (this->m_bcrec_scalars).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)avStack_1d8[0].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8._8_8_ = (Arena *)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (pBVar2 != (pointer)0x0) {
    operator_delete(pBVar2,(long)pBVar3 - (long)pBVar2);
    if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1e8._0_8_,
                      (long)avStack_1d8[0].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - local_1e8._0_8_);
    }
  }
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize
            (&this->m_bcrec_scalars_d,(long)NUM_SCALARS);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            (&local_60,
             &(this->m_bcrec_scalars).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
  amrex::convertToDeviceVector<amrex::BCRec>
            ((DeviceVector<amrex::BCRec> *)local_1e8,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&local_60);
  operator_delete((this->m_bcrec_scalars_d).m_data,(this->m_bcrec_scalars_d).m_capacity * 0x18);
  (this->m_bcrec_scalars_d).m_data = (pointer)local_1e8._0_8_;
  (this->m_bcrec_scalars_d).m_size = local_1e8._8_8_;
  (this->m_bcrec_scalars_d).m_capacity =
       (size_type)
       avStack_1d8[0].
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8._8_8_ = (Arena *)0x0;
  avStack_1d8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_60.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
NavierStokesBase::restart (Amr&          papa,
                           std::istream& is,
                           bool          bReadSpecial)
{
    Print()<<"\nWARNING! Note that you can't drop data from the checkpoint file.\n"
           <<" If your checkpoint file contains Average_Type, then your inputs\n"
	   <<" must also specify ns.avg_interval>0.\n"<<std::endl;

    AmrLevel::restart(papa,is,bReadSpecial);

    if ( gradp_in_checkpoint==0 )
    {
      Print()<<"WARNING! GradP not found in checkpoint file. Recomputing from Pressure."
	     <<std::endl;

      //
      // define state[Gradp_Type] and
      // Compute GradP from the Pressure
      //
      Real cur_time = state[Press_Type].curTime();
      Real prev_time = state[Press_Type].prevTime();
      Real dt = cur_time - prev_time;
      // Because P and Gp are Interval type, this is the time for define()
      Real time = 0.5 * (prev_time + cur_time);

      state[Gradp_Type].define(geom.Domain(), grids, dmap, desc_lst[Gradp_Type],
			       time, dt, Factory());
      computeGradP(cur_time);

      // now allocate the old data and fill
      state[Gradp_Type].allocOldData();
      computeGradP(prev_time);
    }

    //
    // Build metric coefficients for RZ calculations.
    // Build volume and areas.
    //
    buildMetrics();

    if (projector == 0)
    {
        projector = new Projection(parent,&phys_bc,do_sync_proj,
                                   parent->finestLevel(),radius_grow);
    }
    projector->install_level(level, this, &radius);

    if (mac_projector == 0)
    {
        mac_projector = new MacProj(parent,parent->finestLevel(),
                                    &phys_bc,radius_grow);
    }
    mac_projector->install_level(level,this);

    const BoxArray& P_grids = state[Press_Type].boxArray();
#ifdef AMREX_USE_EB
    init_eb(parent->Geom(level), grids, dmap);
#endif

    //
    // Alloc space for density and temporary pressure variables.
    //
    if (level > 0)
    {
        rho_avg.define(grids,dmap,1,1,MFInfo(),Factory());
        p_avg.define(P_grids,dmap,1,0,MFInfo(),Factory());
    }
    //FIXME see similar stuff in constructor
    rho_half.define (grids,dmap,1,1,MFInfo(),Factory());
    rho_ptime.define(grids,dmap,1,1,MFInfo(),Factory());
    rho_ctime.define(grids,dmap,1,1,MFInfo(),Factory());
    rho_qtime  = 0;
    rho_tqtime = 0;

    AMREX_ASSERT(sync_reg == 0);
    if (level > 0 && do_sync_proj)
    {
        sync_reg = new SyncRegister(grids,dmap,crse_ratio);
    }
    AMREX_ASSERT(advflux_reg == 0);
    if (level > 0 && do_reflux)
    {
        advflux_reg = new FluxRegister(grids,dmap,crse_ratio,level,NUM_STATE);
    }
    AMREX_ASSERT(viscflux_reg == 0);
    if (level > 0 && do_reflux)
    {
        viscflux_reg = new FluxRegister(grids,dmap,crse_ratio,level,NUM_STATE);
    }

    if (level < parent->finestLevel())
    {
#ifdef AMREX_USE_EB
        int ng_sync = (redistribution_type == "StateRedist") ? nghost_state() : 1;
#else
	int ng_sync = 1;
#endif

	Vsync.define(grids,dmap,AMREX_SPACEDIM,ng_sync,MFInfo(),Factory());
        Ssync.define(grids,dmap,NUM_STATE-AMREX_SPACEDIM,ng_sync,MFInfo(),Factory());
    }

    diffusion = new Diffusion(parent, this,
                              (level > 0) ? getLevel(level-1).diffusion : 0,
                              NUM_STATE, viscflux_reg,is_diffusive);
    //
    // Allocate the storage for variable viscosity and diffusivity
    //
    diffn_cc = new MultiFab(grids, dmap, NUM_STATE-Density-1, 1, MFInfo(), Factory());
    diffnp1_cc = new MultiFab(grids, dmap, NUM_STATE-Density-1, 1, MFInfo(), Factory());
    viscn_cc = new MultiFab(grids, dmap, 1, 1, MFInfo(), Factory());
    viscnp1_cc = new MultiFab(grids, dmap, 1, 1, MFInfo(), Factory());

    old_intersect_new          = grids;

    //
    // Initialize BCRec for use with advection
    //
    m_bcrec_velocity.resize(AMREX_SPACEDIM);
    m_bcrec_velocity = fetchBCArray(State_Type,Xvel,AMREX_SPACEDIM);

    m_bcrec_velocity_d.resize(AMREX_SPACEDIM);
    m_bcrec_velocity_d = convertToDeviceVector(m_bcrec_velocity);

    m_bcrec_scalars.resize(NUM_SCALARS);
    m_bcrec_scalars = fetchBCArray(State_Type,Density,NUM_SCALARS);

    m_bcrec_scalars_d.resize(NUM_SCALARS);
    m_bcrec_scalars_d = convertToDeviceVector(m_bcrec_scalars);
}